

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

uint8_t bcm2835_i2c_write(char *buf,uint32_t len)

{
  uint32_t *paddr;
  uint32_t *paddr_00;
  uint32_t *paddr_01;
  uint32_t *paddr_02;
  uint32_t uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t uVar5;
  
  paddr_02 = bcm2835_bsc1;
  paddr = bcm2835_bsc1 + 2;
  paddr_00 = bcm2835_bsc1 + 4;
  paddr_01 = bcm2835_bsc1 + 1;
  bcm2835_peri_set_bits(bcm2835_bsc1,0x20,0x20);
  bcm2835_peri_write(paddr_01,0x302);
  bcm2835_peri_write(paddr,len);
  uVar4 = 0x10;
  if (len < 0x10) {
    uVar4 = (ulong)len;
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    bcm2835_peri_write_nb(paddr_00,(int)buf[uVar3]);
  }
  bcm2835_peri_write(paddr_02,0x8080);
  iVar2 = len - (int)uVar3;
  while (uVar1 = bcm2835_peri_read(paddr_01), (uVar1 & 2) == 0) {
    while ((iVar2 != 0 && (uVar1 = bcm2835_peri_read(paddr_01), (uVar1 & 0x10) != 0))) {
      bcm2835_peri_write(paddr_00,(int)buf[uVar4]);
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar2 = iVar2 + -1;
    }
  }
  uVar1 = bcm2835_peri_read(paddr_01);
  uVar5 = '\x01';
  if ((uVar1 >> 8 & 1) == 0) {
    uVar1 = bcm2835_peri_read(paddr_01);
    uVar5 = '\x02';
    if ((uVar1 >> 9 & 1) == 0) {
      uVar5 = (iVar2 != 0) << 2;
    }
  }
  bcm2835_peri_set_bits(paddr_02,2,2);
  return uVar5;
}

Assistant:

uint8_t bcm2835_i2c_write(const char * buf, uint32_t len)
{
#ifdef I2C_V1
    volatile uint32_t* dlen    = bcm2835_bsc0 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc0 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc0 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc0 + BCM2835_BSC_C/4;
#else
    volatile uint32_t* dlen    = bcm2835_bsc1 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc1 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc1 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc1 + BCM2835_BSC_C/4;
#endif    

    uint32_t remaining = len;
    uint32_t i = 0;
    uint8_t reason = BCM2835_I2C_REASON_OK;

    /* Clear FIFO */
    bcm2835_peri_set_bits(control, BCM2835_BSC_C_CLEAR_1 , BCM2835_BSC_C_CLEAR_1 );
    /* Clear Status */
    bcm2835_peri_write(status, BCM2835_BSC_S_CLKT | BCM2835_BSC_S_ERR | BCM2835_BSC_S_DONE);
    /* Set Data Length */
    bcm2835_peri_write(dlen, len);
    /* pre populate FIFO with max buffer */
    while( remaining && ( i < BCM2835_BSC_FIFO_SIZE ) )
    {
        bcm2835_peri_write_nb(fifo, buf[i]);
        i++;
        remaining--;
    }
    
    /* Enable device and start transfer */
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST);
    
    /* Transfer is over when BCM2835_BSC_S_DONE */
    while(!(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE ))
    {
        while ( remaining && (bcm2835_peri_read(status) & BCM2835_BSC_S_TXD ))
    	{
	    /* Write to FIFO */
	    bcm2835_peri_write(fifo, buf[i]);
	    i++;
	    remaining--;
    	}
    }

    /* Received a NACK */
    if (bcm2835_peri_read(status) & BCM2835_BSC_S_ERR)
    {
	reason = BCM2835_I2C_REASON_ERROR_NACK;
    }

    /* Received Clock Stretch Timeout */
    else if (bcm2835_peri_read(status) & BCM2835_BSC_S_CLKT)
    {
	reason = BCM2835_I2C_REASON_ERROR_CLKT;
    }

    /* Not all data is sent */
    else if (remaining)
    {
	reason = BCM2835_I2C_REASON_ERROR_DATA;
    }

    bcm2835_peri_set_bits(control, BCM2835_BSC_S_DONE , BCM2835_BSC_S_DONE);

    return reason;
}